

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::InternalFillFromPrototype
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptArray *srcArray,uint32 start,
               uint32 end,uint32 count)

{
  ScriptContext *requestContext;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  uint32 uVar5;
  int iVar6;
  RecyclableObject *instance;
  JavascriptArray *obj;
  DynamicObject *pDVar7;
  void *pvVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  Var local_b8;
  int local_ac;
  void *local_a8;
  Var oldValue;
  ArrayElementEnumerator e;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  
  instance = RecyclableObject::GetPrototype((RecyclableObject *)srcArray);
  if (count + start != end) {
    jsReentLock._24_8_ = __tls_get_addr(&PTR_0155fe48);
    iVar3 = dstIndex - start;
    do {
      BVar4 = JavascriptOperators::IsNull(instance);
      if (BVar4 != 0) {
        return;
      }
      local_78 = (undefined1  [8])
                 ((((((srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.
                     ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                 ->threadContext;
      jsReentLock.m_threadContext = (ThreadContext *)0x0;
      jsReentLock.m_arrayObject = (Var)0x0;
      jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
      ((ThreadContext *)local_78)->noJsReentrancy = true;
      JsReentLock::setObjectForMutation((JsReentLock *)local_78,srcArray);
      JsReentLock::setSecondObjectForMutation((JsReentLock *)local_78,dstArray);
      bVar2 = DynamicObject::IsAnyArray(instance);
      if ((!bVar2) && (BVar4 = JavascriptOperators::IsObject(instance), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)jsReentLock._24_8_ = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2a76,
                                    "(DynamicObject::IsAnyArray(obj) || JavascriptOperators::IsObject(obj))"
                                    ,
                                    "DynamicObject::IsAnyArray(obj) || JavascriptOperators::IsObject(obj)"
                                   );
        if (!bVar2) goto LAB_00b7b1ec;
        *(undefined4 *)jsReentLock._24_8_ = 0;
      }
      bVar2 = DynamicObject::IsAnyArray(instance);
      if (bVar2) {
        obj = UnsafeFromAnyArray(instance);
      }
      else {
        bVar2 = DynamicType::Is(((instance->type).ptr)->typeId);
        if (bVar2) {
          pDVar7 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(instance);
          bVar2 = DynamicObject::HasObjectArray(pDVar7);
          pDVar7 = *(DynamicObject **)&(pDVar7->field_1).field_1;
          if ((bVar2 && pDVar7 != (DynamicObject *)0x0) &&
             (bVar2 = DynamicObject::IsAnyArray(pDVar7), bVar2)) {
            obj = UnsafeFromAnyArray(pDVar7);
            goto LAB_00b7ae6c;
          }
        }
        obj = (JavascriptArray *)0x0;
      }
LAB_00b7ae6c:
      if (obj != (JavascriptArray *)0x0) {
        bVar2 = IsNonES5Array(obj);
        if (bVar2) {
          EnsureNonNativeArray(obj);
          ArrayElementEnumerator::ArrayElementEnumerator
                    ((ArrayElementEnumerator *)&oldValue,obj,start,end);
LAB_00b7aea2:
          if (oldValue != (Var)0x0) {
            uVar9 = e.seg._4_4_;
            do {
              uVar11 = (ulong)(Type)e.seg;
              uVar10 = (Type)e.seg + 1;
              if ((Type)e.seg + 1 < uVar9) {
                uVar10 = uVar9;
              }
              while (uVar10 - 1 != (int)uVar11) {
                e.seg._0_4_ = (int)uVar11 + 1;
                uVar11 = (ulong)(Type)e.seg;
                if (*(undefined1 **)((long)oldValue + uVar11 * 8 + 0x18) != &DAT_40002fff80002) {
                  uVar5 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)&oldValue);
                  iVar6 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject
                            .super_FinalizableObject.super_IRecyclerVisitedObject.
                            _vptr_IRecyclerVisitedObject[0x70])
                                    (srcArray,(ulong)uVar5,&local_a8,
                                     (((((srcArray->super_ArrayObject).super_DynamicObject.
                                         super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                                     super_JavascriptLibraryBase).scriptContext.ptr);
                  if ((iVar6 == 0) &&
                     ((dstArray == (JavascriptArray *)0x0 ||
                      (BVar4 = DirectGetItemAt<void*>(dstArray,iVar3 + uVar5,&local_a8), BVar4 == 0)
                      ))) {
                    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                    pvVar8 = ArrayElementEnumerator::GetItem<void*>
                                       ((ArrayElementEnumerator *)&oldValue);
                    (*(dstArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x29])(dstArray,(ulong)(uVar5 + iVar3),pvVar8,0);
                    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
                    count = count + 1;
                    *(bool *)((long)local_78 + 0x108) = true;
                  }
                  goto LAB_00b7aea2;
                }
              }
              oldValue = *(Var *)((long)oldValue + 0x10);
              e.seg._0_4_ = uVar10;
              if ((uint *)oldValue != (uint *)0x0) {
                uVar10 = e.endIndex - *oldValue;
                if (e.endIndex < *oldValue || uVar10 == 0) {
                  oldValue = (Var)0x0;
                  break;
                }
                e.seg._0_4_ = 0xffffffff;
                uVar9 = *(uint *)((long)oldValue + 4);
                if (uVar10 < *(uint *)((long)oldValue + 4)) {
                  uVar9 = uVar10;
                }
                e.seg._4_4_ = uVar9;
              }
            } while ((uint *)oldValue != (uint *)0x0);
          }
        }
        else {
          requestContext =
               (((((instance->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
          bVar2 = VarIs<Js::ES5Array,Js::JavascriptArray>(obj);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)jsReentLock._24_8_ = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x2a9d,"(VarIs<ES5Array>(arr))","VarIs<ES5Array>(arr)");
            if (!bVar2) {
LAB_00b7b1ec:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)jsReentLock._24_8_ = 0;
          }
          oldValue = VarTo<Js::ES5Array,Js::JavascriptArray>(obj);
          e.seg._0_4_ = (((ES5Array *)oldValue)->super_JavascriptArray).super_ArrayObject.length;
          e._4_8_ = 0xffffffffffffffff;
          e.endIndex = 0xffffffff;
          e.start = 0;
          e.end = 0;
          while (bVar2 = ES5ArrayIndexStaticEnumerator<true>::MoveNext
                                   ((ES5ArrayIndexStaticEnumerator<true> *)&oldValue,
                                    (PropertyAttributes *)0x0), bVar2) {
            uVar9 = e.seg._4_4_;
            if (start <= e.seg._4_4_) {
              if (end <= e.seg._4_4_) break;
              iVar6 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject[0x70])
                                (srcArray,e._4_8_ & 0xffffffff,&local_a8,
                                 (((((srcArray->super_ArrayObject).super_DynamicObject.
                                     super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                                 super_JavascriptLibraryBase).scriptContext.ptr);
              if ((iVar6 == 0) &&
                 ((dstArray == (JavascriptArray *)0x0 ||
                  (BVar4 = DirectGetItemAt<void*>(dstArray,iVar3 + uVar9,&local_a8), BVar4 == 0))))
              {
                local_b8 = (Var)0x0;
                *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                local_ac = JavascriptOperators::GetOwnItem(instance,uVar9,&local_b8,requestContext);
                JsReentLock::MutateArrayObject((JsReentLock *)local_78);
                *(bool *)((long)local_78 + 0x108) = true;
                if (local_ac != 0) {
                  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                  (*(dstArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x29])(dstArray,(ulong)(uVar9 + iVar3),local_b8,0);
                  JsReentLock::MutateArrayObject((JsReentLock *)local_78);
                  count = count + 1;
                  *(bool *)((long)local_78 + 0x108) = true;
                }
              }
            }
          }
        }
      }
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      instance = RecyclableObject::GetPrototype(instance);
    } while (count + start != end);
  }
  return;
}

Assistant:

void JavascriptArray::InternalFillFromPrototype(JavascriptArray *dstArray, uint32 dstIndex, JavascriptArray *srcArray, uint32 start, uint32 end, uint32 count)
    {
        RecyclableObject* prototype = srcArray->GetPrototype();
        while (start + count != end && !JavascriptOperators::IsNull(prototype))
        {
            ForEachOwnMissingArrayIndexOfObject(srcArray, dstArray, prototype, start, end, dstIndex, [&](uint32 index, Var value) {
                uint32 n = dstIndex + (index - start);
                dstArray->SetItem(n, value, PropertyOperation_None);

                count++;
            });

            prototype = prototype->GetPrototype();
        }
    }